

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_dispatch.c
# Opt level: O0

int luaJIT_setmode(lua_State *L,int idx,int mode)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  global_State *g_00;
  jit_State *pt_00;
  ulong *puVar4;
  uint in_EDX;
  int in_ESI;
  long in_RDI;
  cTValue *tv_1;
  GCproto *pt;
  cTValue *tv;
  int mm;
  global_State *g;
  GCproto *in_stack_ffffffffffffff98;
  ErrMsg em;
  jit_State *in_stack_ffffffffffffffa0;
  jit_State *in_stack_ffffffffffffffb0;
  lua_State *in_stack_ffffffffffffffc0;
  
  g_00 = (global_State *)(ulong)*(uint *)(in_RDI + 8);
  uVar3 = in_EDX & 0xff;
  g_00[1].uvhead.field_5.field_1.next.gcptr32 =
       g_00[1].uvhead.field_5.field_1.next.gcptr32 & 0xffffffef;
  em = (ErrMsg)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  if ((g_00->hookmask & 0x40) != 0) {
    lj_err_caller((lua_State *)in_stack_ffffffffffffffa0,em);
  }
  switch(uVar3) {
  case 0:
    if ((in_EDX & 0x200) == 0) {
      if ((in_EDX & 0x100) == 0) {
        g_00[1].strempty.hash = g_00[1].strempty.hash & 0xfffffffe;
      }
      else {
        if ((g_00[1].strempty.hash & 0x20) == 0) {
          return 0;
        }
        g_00[1].strempty.hash = g_00[1].strempty.hash | 1;
      }
      lj_dispatch_update(g_00);
    }
    else {
      lj_trace_flushall(in_stack_ffffffffffffffc0);
    }
    break;
  default:
    return 0;
  case 2:
  case 3:
  case 4:
    if (in_ESI == 0) {
      if ((*(uint *)(*(long *)(in_RDI + 0x10) + -4) & 3) == 0) {
        pt_00 = (jit_State *)
                (*(long *)(in_RDI + 0x10) + -8 +
                (ulong)((*(uint *)((ulong)*(uint *)(*(long *)(in_RDI + 0x10) + -4) - 4) >> 8 & 0xff)
                       + 1) * -8);
        in_stack_ffffffffffffffb0 = pt_00;
      }
      else {
        pt_00 = (jit_State *)
                ((*(long *)(in_RDI + 0x10) + -8) -
                (long)(int)(*(uint *)(*(long *)(in_RDI + 0x10) + -4) & 0xfffffff8));
        in_stack_ffffffffffffffb0 = pt_00;
      }
    }
    else if (in_ESI < 1) {
      in_stack_ffffffffffffffa0 = (jit_State *)(*(long *)(in_RDI + 0x18) + (long)in_ESI * 8);
      pt_00 = in_stack_ffffffffffffffa0;
    }
    else {
      in_stack_ffffffffffffffa0 = (jit_State *)(*(long *)(in_RDI + 0x10) + (long)(in_ESI + -1) * 8);
      pt_00 = in_stack_ffffffffffffffa0;
    }
    if ((((in_ESI != 0) &&
         (iVar1._0_1_ = (pt_00->cur).marked, iVar1._1_1_ = (pt_00->cur).gct,
         iVar1._2_1_ = (pt_00->cur).topslot, iVar1._3_1_ = (pt_00->cur).linktype, iVar1 != -9)) ||
        (*(char *)((ulong)(pt_00->cur).nextgc.gcptr32 + 6) != '\0')) &&
       (iVar2._0_1_ = (pt_00->cur).marked, iVar2._1_1_ = (pt_00->cur).gct,
       iVar2._2_1_ = (pt_00->cur).topslot, iVar2._3_1_ = (pt_00->cur).linktype, iVar2 != -8)) {
      return 0;
    }
    if (uVar3 != 4) {
      setptmode((global_State *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,0);
    }
    if (uVar3 != 2) {
      setptmode_all((global_State *)in_stack_ffffffffffffffb0,(GCproto *)pt_00,
                    (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
    }
    break;
  case 5:
    if ((in_EDX & 0x200) == 0) {
      return 0;
    }
    lj_trace_flush(in_stack_ffffffffffffffa0,em);
    break;
  case 0x10:
    if ((in_EDX & 0x100) == 0) {
      g_00->bc_cfunc_ext = 0x5b;
    }
    else {
      if (in_ESI == 0) {
        return 0;
      }
      if (in_ESI < 1) {
        puVar4 = (ulong *)(*(long *)(in_RDI + 0x18) + (long)in_ESI * 8);
      }
      else {
        puVar4 = (ulong *)(*(long *)(in_RDI + 0x10) + (long)(in_ESI + -1) * 8);
      }
      if (*(int *)((long)puVar4 + 4) >> 0xf != -2) {
        return 0;
      }
      g_00->wrapf = (lua_CFunction)(*puVar4 & 0x7fffffffffff);
      g_00->bc_cfunc_ext = 0x5c;
    }
  }
  return 1;
}

Assistant:

int luaJIT_setmode(lua_State *L, int idx, int mode)
{
  global_State *g = G(L);
  int mm = mode & LUAJIT_MODE_MASK;
  lj_trace_abort(g);  /* Abort recording on any state change. */
  /* Avoid pulling the rug from under our own feet. */
  if ((g->hookmask & HOOK_GC))
    lj_err_caller(L, LJ_ERR_NOGCMM);
  switch (mm) {
#if LJ_HASJIT
  case LUAJIT_MODE_ENGINE:
    if ((mode & LUAJIT_MODE_FLUSH)) {
      lj_trace_flushall(L);
    } else {
      if (!(mode & LUAJIT_MODE_ON))
	G2J(g)->flags &= ~(uint32_t)JIT_F_ON;
#if LJ_TARGET_X86ORX64
      else if ((G2J(g)->flags & JIT_F_SSE2))
	G2J(g)->flags |= (uint32_t)JIT_F_ON;
      else
	return 0;  /* Don't turn on JIT compiler without SSE2 support. */
#else
      else
	G2J(g)->flags |= (uint32_t)JIT_F_ON;
#endif
      lj_dispatch_update(g);
    }
    break;
  case LUAJIT_MODE_FUNC:
  case LUAJIT_MODE_ALLFUNC:
  case LUAJIT_MODE_ALLSUBFUNC: {
    cTValue *tv = idx == 0 ? frame_prev(L->base-1) :
		  idx > 0 ? L->base + (idx-1) : L->top + idx;
    GCproto *pt;
    if ((idx == 0 || tvisfunc(tv)) && isluafunc(&gcval(tv)->fn))
      pt = funcproto(&gcval(tv)->fn);  /* Cannot use funcV() for frame slot. */
    else if (tvisproto(tv))
      pt = protoV(tv);
    else
      return 0;  /* Failed. */
    if (mm != LUAJIT_MODE_ALLSUBFUNC)
      setptmode(g, pt, mode);
    if (mm != LUAJIT_MODE_FUNC)
      setptmode_all(g, pt, mode);
    break;
    }
  case LUAJIT_MODE_TRACE:
    if (!(mode & LUAJIT_MODE_FLUSH))
      return 0;  /* Failed. */
    lj_trace_flush(G2J(g), idx);
    break;
#else
  case LUAJIT_MODE_ENGINE:
  case LUAJIT_MODE_FUNC:
  case LUAJIT_MODE_ALLFUNC:
  case LUAJIT_MODE_ALLSUBFUNC:
    UNUSED(idx);
    if ((mode & LUAJIT_MODE_ON))
      return 0;  /* Failed. */
    break;
#endif
  case LUAJIT_MODE_WRAPCFUNC:
    if ((mode & LUAJIT_MODE_ON)) {
      if (idx != 0) {
	cTValue *tv = idx > 0 ? L->base + (idx-1) : L->top + idx;
	if (tvislightud(tv))
	  g->wrapf = (lua_CFunction)lightudV(tv);
	else
	  return 0;  /* Failed. */
      } else {
	return 0;  /* Failed. */
      }
      g->bc_cfunc_ext = BCINS_AD(BC_FUNCCW, 0, 0);
    } else {
      g->bc_cfunc_ext = BCINS_AD(BC_FUNCC, 0, 0);
    }
    break;
  default:
    return 0;  /* Failed. */
  }
  return 1;  /* OK. */
}